

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2pShaderOperatorTests.cpp
# Opt level: O3

vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
* __thiscall
deqp::gles2::Performance::anon_unknown_1::FunctionCase::generateProgramData
          (vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
           *__return_storage_ptr__,FunctionCase *this)

{
  bool bVar1;
  ProgramID programID;
  bool bVar2;
  ProgramContext local_a8;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  programID = PROGRAM_WITH_FUNCTION_CALLS;
  bVar1 = true;
  do {
    bVar2 = bVar1;
    generateSingleProgramData(&local_a8,this,programID);
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::ProgramContext>_>
    ::push_back(__return_storage_ptr__,&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.description._M_dataplus._M_p != &local_a8.description.field_2) {
      operator_delete(local_a8.description._M_dataplus._M_p,
                      local_a8.description.field_2._M_allocated_capacity + 1);
    }
    std::
    vector<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec,_std::allocator<deqp::gles2::Performance::(anonymous_namespace)::OperatorPerformanceCase::AttribSpec>_>
    ::~vector(&local_a8.attributes);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.fragShaderSource._M_dataplus._M_p != &local_a8.fragShaderSource.field_2) {
      operator_delete(local_a8.fragShaderSource._M_dataplus._M_p,
                      local_a8.fragShaderSource.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8.vertShaderSource._M_dataplus._M_p != &local_a8.vertShaderSource.field_2) {
      operator_delete(local_a8.vertShaderSource._M_dataplus._M_p,
                      local_a8.vertShaderSource.field_2._M_allocated_capacity + 1);
    }
    programID = PROGRAM_WITHOUT_FUNCTION_CALLS;
    bVar1 = false;
  } while (bVar2);
  return __return_storage_ptr__;
}

Assistant:

vector<FunctionCase::ProgramContext> FunctionCase::generateProgramData (void) const
{
	vector<ProgramContext> progData;
	for (int i = 0; i < PROGRAM_LAST; i++)
		progData.push_back(generateSingleProgramData((ProgramID)i));
	return progData;
}